

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameEditSql(sqlite3_context *pCtx,RenameCtx *pRename,char *zSql,char *zNew,int bQuote)

{
  uint uVar1;
  int iVar2;
  sqlite3 *db_00;
  char *z;
  char *z_00;
  RenameToken *p;
  char *local_88;
  char *zReplace;
  u32 nReplace;
  RenameToken *pBest;
  int local_68;
  int iOff;
  int nOut;
  int nQuot;
  char *zOut;
  char *zQuot;
  int rc;
  sqlite3 *db;
  uint local_38;
  int nSql;
  int nNew;
  int bQuote_local;
  char *zNew_local;
  char *zSql_local;
  RenameCtx *pRename_local;
  sqlite3_context *pCtx_local;
  
  local_38 = sqlite3Strlen30(zNew);
  local_68 = sqlite3Strlen30(zSql);
  db_00 = sqlite3_context_db_handle(pCtx);
  zQuot._4_4_ = 0;
  z = sqlite3MPrintf(db_00,"\"%w\"",zNew);
  if (z == (char *)0x0) {
    pCtx_local._4_4_ = 7;
  }
  else {
    uVar1 = sqlite3Strlen30(z);
    _nNew = zNew;
    if (bQuote != 0) {
      local_38 = uVar1;
      _nNew = z;
    }
    z_00 = (char *)sqlite3DbMallocZero(db_00,(long)(int)(local_68 + pRename->nList * uVar1 + 1));
    if (z_00 == (char *)0x0) {
      zQuot._4_4_ = 7;
    }
    else {
      memcpy(z_00,zSql,(long)local_68);
      while (pRename->pList != (RenameToken *)0x0) {
        p = renameColumnTokenNext(pRename);
        iVar2 = sqlite3IsIdChar(*(p->t).z);
        local_88 = z;
        zReplace._4_4_ = uVar1;
        if (iVar2 != 0) {
          zReplace._4_4_ = local_38;
          local_88 = _nNew;
        }
        iVar2 = (int)(p->t).z - (int)zSql;
        if ((p->t).n != zReplace._4_4_) {
          memmove(z_00 + (iVar2 + zReplace._4_4_),z_00 + (iVar2 + (p->t).n),
                  (ulong)(local_68 - (iVar2 + (p->t).n)));
          local_68 = (zReplace._4_4_ - (p->t).n) + local_68;
          z_00[local_68] = '\0';
        }
        memcpy(z_00 + iVar2,local_88,(ulong)zReplace._4_4_);
        sqlite3DbFree(db_00,p);
      }
      sqlite3_result_text(pCtx,z_00,-1,(_func_void_void_ptr *)0xffffffffffffffff);
      sqlite3DbFree(db_00,z_00);
    }
    sqlite3_free(z);
    pCtx_local._4_4_ = zQuot._4_4_;
  }
  return pCtx_local._4_4_;
}

Assistant:

static int renameEditSql(
  sqlite3_context *pCtx,          /* Return result here */
  RenameCtx *pRename,             /* Rename context */
  const char *zSql,               /* SQL statement to edit */
  const char *zNew,               /* New token text */
  int bQuote                      /* True to always quote token */
){
  int nNew = sqlite3Strlen30(zNew);
  int nSql = sqlite3Strlen30(zSql);
  sqlite3 *db = sqlite3_context_db_handle(pCtx);
  int rc = SQLITE_OK;
  char *zQuot;
  char *zOut;
  int nQuot;

  /* Set zQuot to point to a buffer containing a quoted copy of the 
  ** identifier zNew. If the corresponding identifier in the original 
  ** ALTER TABLE statement was quoted (bQuote==1), then set zNew to
  ** point to zQuot so that all substitutions are made using the
  ** quoted version of the new column name.  */
  zQuot = sqlite3MPrintf(db, "\"%w\"", zNew);
  if( zQuot==0 ){
    return SQLITE_NOMEM;
  }else{
    nQuot = sqlite3Strlen30(zQuot);
  }
  if( bQuote ){
    zNew = zQuot;
    nNew = nQuot;
  }

  /* At this point pRename->pList contains a list of RenameToken objects
  ** corresponding to all tokens in the input SQL that must be replaced
  ** with the new column name. All that remains is to construct and
  ** return the edited SQL string. */
  assert( nQuot>=nNew );
  zOut = sqlite3DbMallocZero(db, nSql + pRename->nList*nQuot + 1);
  if( zOut ){
    int nOut = nSql;
    memcpy(zOut, zSql, nSql);
    while( pRename->pList ){
      int iOff;                   /* Offset of token to replace in zOut */
      RenameToken *pBest = renameColumnTokenNext(pRename);

      u32 nReplace;
      const char *zReplace;
      if( sqlite3IsIdChar(*pBest->t.z) ){
        nReplace = nNew;
        zReplace = zNew;
      }else{
        nReplace = nQuot;
        zReplace = zQuot;
      }

      iOff = pBest->t.z - zSql;
      if( pBest->t.n!=nReplace ){
        memmove(&zOut[iOff + nReplace], &zOut[iOff + pBest->t.n], 
            nOut - (iOff + pBest->t.n)
        );
        nOut += nReplace - pBest->t.n;
        zOut[nOut] = '\0';
      }
      memcpy(&zOut[iOff], zReplace, nReplace);
      sqlite3DbFree(db, pBest);
    }

    sqlite3_result_text(pCtx, zOut, -1, SQLITE_TRANSIENT);
    sqlite3DbFree(db, zOut);
  }else{
    rc = SQLITE_NOMEM;
  }

  sqlite3_free(zQuot);
  return rc;
}